

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O0

void __thiscall
MissingDependencyScannerTestCycleInGraph::Run(MissingDependencyScannerTestCycleInGraph *this)

{
  pointer *err_00;
  Test *this_00;
  bool bVar1;
  undefined1 local_48 [8];
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  string err;
  MissingDependencyScannerTestCycleInGraph *this_local;
  
  MissingDependencyScannerTest::CreateInitialState(&this->super_MissingDependencyScannerTest);
  MissingDependencyScannerTest::CreateGraphDependencyBetween
            (&this->super_MissingDependencyScannerTest,"compiled_object","generated_header");
  MissingDependencyScannerTest::CreateGraphDependencyBetween
            (&this->super_MissingDependencyScannerTest,"generated_header","compiled_object");
  err_00 = &nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)err_00);
  State::RootNodes((vector<Node_*,_std::allocator<Node_*>_> *)local_48,
                   &(this->super_MissingDependencyScannerTest).state_,(string *)err_00);
  this_00 = g_current_test;
  bVar1 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::Test::Check
                    (this_00,bVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0xa0,"\"\" != err");
  if (!bVar1) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)local_48);
  std::__cxx11::string::~string
            ((string *)
             &nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, CycleInGraph) {
  CreateInitialState();
  CreateGraphDependencyBetween("compiled_object", "generated_header");
  CreateGraphDependencyBetween("generated_header", "compiled_object");
  // The missing-deps tool doesn't deal with cycles in the graph, because
  // there will be an error loading the graph before we get to the tool.
  // This test is to illustrate that.
  std::string err;
  std::vector<Node*> nodes = state_.RootNodes(&err);
  ASSERT_NE("", err);
}